

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

void jp2_destroy_compress(opj_jp2_t *jp2)

{
  if (jp2 != (opj_jp2_t *)0x0) {
    j2k_destroy_compress(jp2->j2k);
    if (jp2->comps != (opj_jp2_comps_t *)0x0) {
      free(jp2->comps);
    }
    if (jp2->cl != (uint *)0x0) {
      free(jp2->cl);
    }
    free(jp2);
    return;
  }
  return;
}

Assistant:

void jp2_destroy_compress(opj_jp2_t *jp2) {
	if(jp2) {
		/* destroy the J2K codec */
		j2k_destroy_compress(jp2->j2k);

		if(jp2->comps) {
			opj_free(jp2->comps);
		}
		if(jp2->cl) {
			opj_free(jp2->cl);
		}
		opj_free(jp2);
	}
}